

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O1

JavascriptString *
Js::WebAssemblyModule::GetExternalKindString(ScriptContext *scriptContext,ExternalKinds kind)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  StaticType *type;
  JavascriptString *pJVar4;
  undefined4 *puVar5;
  Recycler *recycler;
  charcount_t charLength;
  undefined7 in_register_00000031;
  char16 *content;
  
  switch(CONCAT71(in_register_00000031,kind) & 0xffffffff) {
  case 0:
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
    recycler = pJVar1->recycler;
    content = L"function";
    charLength = 8;
    goto LAB_00d9e18b;
  case 1:
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
    recycler = pJVar1->recycler;
    content = L"table";
    charLength = 5;
    goto LAB_00d9e18b;
  case 2:
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
    recycler = pJVar1->recycler;
    content = L"memory";
    break;
  case 3:
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
    recycler = pJVar1->recycler;
    content = L"global";
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x3b8,"((0))","(0)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    return (JavascriptString *)0x0;
  }
  charLength = 6;
LAB_00d9e18b:
  pJVar4 = &LiteralString::New(type,content,charLength,recycler)->super_JavascriptString;
  return pJVar4;
}

Assistant:

JavascriptString *
WebAssemblyModule::GetExternalKindString(ScriptContext * scriptContext, Wasm::ExternalKinds kind)
{
    switch (kind)
    {
    case Wasm::ExternalKinds::Function:
        return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("function"));
    case Wasm::ExternalKinds::Table:
        return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("table"));
    case Wasm::ExternalKinds::Memory:
        return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("memory"));
    case Wasm::ExternalKinds::Global:
        return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("global"));
    default:
        Assume(UNREACHED);
    }
    return nullptr;
}